

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000186730 = 0x2d2d2d2d2d2d2d;
    uRam0000000000186737._0_1_ = '-';
    uRam0000000000186737._1_1_ = '-';
    uRam0000000000186737._2_1_ = '-';
    uRam0000000000186737._3_1_ = '-';
    uRam0000000000186737._4_1_ = '-';
    uRam0000000000186737._5_1_ = '-';
    uRam0000000000186737._6_1_ = '-';
    uRam0000000000186737._7_1_ = '-';
    DAT_00186720 = '-';
    DAT_00186720_1._0_1_ = '-';
    DAT_00186720_1._1_1_ = '-';
    DAT_00186720_1._2_1_ = '-';
    DAT_00186720_1._3_1_ = '-';
    DAT_00186720_1._4_1_ = '-';
    DAT_00186720_1._5_1_ = '-';
    DAT_00186720_1._6_1_ = '-';
    uRam0000000000186728 = 0x2d2d2d2d2d2d2d;
    DAT_0018672f = 0x2d;
    DAT_00186710 = '-';
    DAT_00186710_1._0_1_ = '-';
    DAT_00186710_1._1_1_ = '-';
    DAT_00186710_1._2_1_ = '-';
    DAT_00186710_1._3_1_ = '-';
    DAT_00186710_1._4_1_ = '-';
    DAT_00186710_1._5_1_ = '-';
    DAT_00186710_1._6_1_ = '-';
    uRam0000000000186718._0_1_ = '-';
    uRam0000000000186718._1_1_ = '-';
    uRam0000000000186718._2_1_ = '-';
    uRam0000000000186718._3_1_ = '-';
    uRam0000000000186718._4_1_ = '-';
    uRam0000000000186718._5_1_ = '-';
    uRam0000000000186718._6_1_ = '-';
    uRam0000000000186718._7_1_ = '-';
    DAT_00186700 = '-';
    DAT_00186700_1._0_1_ = '-';
    DAT_00186700_1._1_1_ = '-';
    DAT_00186700_1._2_1_ = '-';
    DAT_00186700_1._3_1_ = '-';
    DAT_00186700_1._4_1_ = '-';
    DAT_00186700_1._5_1_ = '-';
    DAT_00186700_1._6_1_ = '-';
    uRam0000000000186708._0_1_ = '-';
    uRam0000000000186708._1_1_ = '-';
    uRam0000000000186708._2_1_ = '-';
    uRam0000000000186708._3_1_ = '-';
    uRam0000000000186708._4_1_ = '-';
    uRam0000000000186708._5_1_ = '-';
    uRam0000000000186708._6_1_ = '-';
    uRam0000000000186708._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001866f8._0_1_ = '-';
    uRam00000000001866f8._1_1_ = '-';
    uRam00000000001866f8._2_1_ = '-';
    uRam00000000001866f8._3_1_ = '-';
    uRam00000000001866f8._4_1_ = '-';
    uRam00000000001866f8._5_1_ = '-';
    uRam00000000001866f8._6_1_ = '-';
    uRam00000000001866f8._7_1_ = '-';
    DAT_0018673f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}